

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  string *psVar1;
  string *args_2;
  ostream *poVar2;
  cmGeneratedFileStream fout;
  char local_292 [2];
  cmGeneratedFileStream local_290;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  local_292[1] = 0x2f;
  (*(lg->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])(&local_290,lg,target);
  local_292[0] = '/';
  args_2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[8]>
            (__return_storage_ptr__,psVar1,local_292 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_290,
             local_292,args_2,(char (*) [8])".objlib");
  std::__cxx11::string::~string((string *)&local_290);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_290,__return_storage_ptr__,false,None);
  if (((&local_290.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)*(_func_int **)
               ((long)local_290.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream + -0x18)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)&local_290,"# This is a dummy file for the OBJECT library ")
    ;
    psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2," for the CMake CodeBlocks project generator.\n");
    std::operator<<(poVar2,"# Don\'t edit, this file will be overwritten.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_290);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                  lg->GetTargetDirectory(target), '/',
                                  target->GetName(), ".objlib");
  cmGeneratedFileStream fout(filename);
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}